

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O2

uint __thiscall Kernel::Clause::getNumeralWeight(Clause *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TermList t;
  Literal **ppLVar4;
  uint uVar5;
  TermList TVar6;
  uint uVar7;
  IntegerConstantType intVal;
  RationalConstantType ratVal;
  RealConstantType realVal;
  NonVariableIterator nvi;
  uint local_dc;
  __mpz_struct local_d8;
  undefined1 local_c8 [32];
  RationalConstantType local_a8;
  NonVariableIterator local_88;
  RationalConstantType local_50;
  
  uVar7 = *(uint *)&this->field_0x38 & 0xfffff;
  uVar5 = (uint)(uVar7 != 0);
  ppLVar4 = (Literal **)0x0;
  if (uVar7 != 0) {
    ppLVar4 = this->_literals;
  }
  local_dc = 0;
  do {
    if (ppLVar4 == (Literal **)0x0) {
      return local_dc;
    }
    if ((((*ppLVar4)->super_Term).field_0xf & 0x40) != 0) {
      NonVariableIterator::NonVariableIterator(&local_88,&(*ppLVar4)->super_Term,false);
      while (local_88._stack._cursor != local_88._stack._stack) {
        t = NonVariableIterator::next(&local_88);
        if (((*(uint *)(t._content + 0xc) & 0xfffffff) == 0) &&
           ((*(byte *)(t._content + 0x28) & 0x20) == 0)) {
          mpz_init(&local_d8);
          TVar6 = t;
          bVar1 = Theory::tryInterpretConstant
                            ((Theory *)theory,(Term *)t._content,(IntegerConstantType *)&local_d8);
          if (bVar1) {
            iVar2 = getNumeralWeight::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)&local_d8,
                               (IntegerConstantType *)TVar6._content);
            if (iVar2 < 1) {
              iVar2 = 0;
            }
            local_dc = local_dc + iVar2;
          }
          else {
            RationalConstantType::RationalConstantType((RationalConstantType *)local_c8);
            RationalConstantType::RationalConstantType(&local_a8);
            TVar6 = t;
            bVar1 = Theory::tryInterpretConstant
                              ((Theory *)theory,(Term *)t._content,(RationalConstantType *)local_c8)
            ;
            if (bVar1) {
LAB_00420a94:
              iVar2 = getNumeralWeight::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)local_c8,
                                 (IntegerConstantType *)TVar6._content);
              iVar3 = getNumeralWeight::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)(local_c8 + 0x10),
                                 (IntegerConstantType *)TVar6._content);
              iVar3 = iVar3 + iVar2;
              if (iVar3 < 1) {
                iVar3 = 0;
              }
              local_dc = local_dc + iVar3;
            }
            else {
              bVar1 = Theory::tryInterpretConstant
                                ((Theory *)theory,(Term *)t._content,(RealConstantType *)&local_a8);
              if (bVar1) {
                RationalConstantType::RationalConstantType(&local_50,&local_a8);
                TVar6._content = (uint64_t)&local_50;
                RationalConstantType::operator=((RationalConstantType *)local_c8,&local_50);
                RationalConstantType::~RationalConstantType(&local_50);
                goto LAB_00420a94;
              }
            }
            RationalConstantType::~RationalConstantType(&local_a8);
            RationalConstantType::~RationalConstantType((RationalConstantType *)local_c8);
          }
          IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&local_d8);
        }
      }
      NonVariableIterator::~NonVariableIterator(&local_88);
    }
    ppLVar4 = this->_literals + (int)uVar5;
    if (uVar7 <= uVar5) {
      ppLVar4 = (Literal **)0x0;
    }
    uVar5 = uVar5 + (uVar5 < uVar7);
  } while( true );
}

Assistant:

unsigned Clause::getNumeralWeight() const {
  unsigned res = 0;
  for (Literal* lit : iterLits()) {
    if (!lit->hasInterpretedConstants()) {
      continue;
    }
    NonVariableIterator nvi(lit);
    while (nvi.hasNext()) {
      const Term* t = nvi.next().term();
      if (t->arity() != 0 || t->isSort()) {
        continue;
      }
      IntegerConstantType intVal;
      auto intWeight = [](IntegerConstantType const& i) {
        return (i.abs().log2() - IntegerConstantType(1)).cvt<int>()
          .orElse([&]() { return std::numeric_limits<int>::max(); });
      };

      if (theory->tryInterpretConstant(t, intVal)) {
        int w = intWeight(intVal);
        if (w > 0) {
          res += w;
        }
        continue;
      }
      RationalConstantType ratVal;
      RealConstantType realVal;
      bool haveRat = false;

      if (theory->tryInterpretConstant(t, ratVal)) {
        haveRat = true;
      } else if (theory->tryInterpretConstant(t, realVal)) {
        ratVal = RationalConstantType(realVal);
        haveRat = true;
      }
      if (!haveRat) {
        continue;
      }
      int wN = intWeight(ratVal.numerator());
      int wD = intWeight(ratVal.denominator());
      int v = wN + wD;
      if (v > 0) {
        res += v;
      }
    }
  }
  return res;
}